

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::box_base<pico_tree::internal::box<float,_2UL>_>::fit
          (box_base<pico_tree::internal::box<float,_2UL>_> *this,scalar_type *x)

{
  box<float,_2UL> *this_00;
  size_type sVar1;
  scalar_type *psVar2;
  long in_RSI;
  box_base<pico_tree::internal::box<float,_2UL>_> *in_RDI;
  size_type i;
  scalar_type in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  scalar_type in_stack_ffffffffffffffd0;
  float fVar3;
  undefined8 local_18;
  
  local_18 = 0;
  while( true ) {
    this_00 = derived(in_RDI);
    sVar1 = box<float,_2UL>::size(this_00);
    if (sVar1 <= local_18) break;
    fVar3 = *(float *)(in_RSI + local_18 * 4);
    psVar2 = min((box_base<pico_tree::internal::box<float,_2UL>_> *)
                 CONCAT44(fVar3,in_stack_ffffffffffffffd0),
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (fVar3 < *psVar2) {
      in_stack_ffffffffffffffd0 = *(scalar_type *)(in_RSI + local_18 * 4);
      psVar2 = min((box_base<pico_tree::internal::box<float,_2UL>_> *)
                   CONCAT44(fVar3,in_stack_ffffffffffffffd0),
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      *psVar2 = in_stack_ffffffffffffffd0;
    }
    in_stack_ffffffffffffffcc = *(float *)(in_RSI + local_18 * 4);
    psVar2 = max((box_base<pico_tree::internal::box<float,_2UL>_> *)
                 CONCAT44(fVar3,in_stack_ffffffffffffffd0),
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (*psVar2 <= in_stack_ffffffffffffffcc && in_stack_ffffffffffffffcc != *psVar2) {
      in_stack_ffffffffffffffc8 = *(scalar_type *)(in_RSI + local_18 * 4);
      psVar2 = max((box_base<pico_tree::internal::box<float,_2UL>_> *)
                   CONCAT44(fVar3,in_stack_ffffffffffffffd0),
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      *psVar2 = in_stack_ffffffffffffffc8;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

constexpr void fit(scalar_type const* x) {
    for (size_type i = 0; i < derived().size(); ++i) {
      if (x[i] < min(i)) {
        min(i) = x[i];
      }
      if (x[i] > max(i)) {
        max(i) = x[i];
      }
    }
  }